

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cvodea.c
# Opt level: O1

int CVAhermiteStorePnt(CVodeMem cv_mem,CVdtpntMem d)

{
  CVadjMemRec *pCVar1;
  undefined8 *puVar2;
  sunrealtype *psVar3;
  undefined1 auVar4 [16];
  int iVar5;
  long lVar6;
  long lVar7;
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  undefined1 auVar11 [16];
  long lVar10;
  
  pCVar1 = cv_mem->cv_adj_mem;
  puVar2 = (undefined8 *)d->content;
  N_VScale(0x3ff0000000000000,cv_mem->cv_zn[0],*puVar2);
  auVar4 = _DAT_00138040;
  if (pCVar1->ca_IMstoreSensi != 0) {
    iVar5 = cv_mem->cv_Ns;
    lVar7 = (long)iVar5;
    if (0 < lVar7) {
      psVar3 = cv_mem->cv_cvals;
      lVar6 = lVar7 + -1;
      auVar8._8_4_ = (int)lVar6;
      auVar8._0_8_ = lVar6;
      auVar8._12_4_ = (int)((ulong)lVar6 >> 0x20);
      lVar6 = 0;
      auVar8 = auVar8 ^ _DAT_00138040;
      auVar9 = _DAT_00138030;
      do {
        auVar11 = auVar9 ^ auVar4;
        if ((bool)(~(auVar11._4_4_ == auVar8._4_4_ && auVar8._0_4_ < auVar11._0_4_ ||
                    auVar8._4_4_ < auVar11._4_4_) & 1)) {
          *(undefined8 *)((long)psVar3 + lVar6) = 0x3ff0000000000000;
        }
        if ((auVar11._12_4_ != auVar8._12_4_ || auVar11._8_4_ <= auVar8._8_4_) &&
            auVar11._12_4_ <= auVar8._12_4_) {
          *(undefined8 *)((long)psVar3 + lVar6 + 8) = 0x3ff0000000000000;
        }
        lVar10 = auVar9._8_8_;
        auVar9._0_8_ = auVar9._0_8_ + 2;
        auVar9._8_8_ = lVar10 + 2;
        lVar6 = lVar6 + 0x10;
      } while ((ulong)(iVar5 + 1U >> 1) << 4 != lVar6);
    }
    iVar5 = N_VScaleVectorArray(lVar7,cv_mem->cv_cvals,cv_mem->cv_znS[0],puVar2[2]);
    if (iVar5 != 0) {
      return -0x1c;
    }
  }
  if (cv_mem->cv_nst == 0) {
    (*cv_mem->cv_f)(cv_mem->cv_tn,(N_Vector)*puVar2,(N_Vector)puVar2[1],cv_mem->cv_user_data);
    if (pCVar1->ca_IMstoreSensi != 0) {
      cvSensRhsWrapper(cv_mem,cv_mem->cv_tn,(N_Vector)*puVar2,(N_Vector)puVar2[1],
                       (N_Vector *)puVar2[2],(N_Vector *)puVar2[3],cv_mem->cv_tempv,cv_mem->cv_ftemp
                      );
    }
  }
  else {
    N_VScale(1.0 / cv_mem->cv_h,cv_mem->cv_zn[1]);
    if (pCVar1->ca_IMstoreSensi != 0) {
      lVar7 = (long)cv_mem->cv_Ns;
      if (0 < lVar7) {
        psVar3 = cv_mem->cv_cvals;
        lVar6 = 0;
        do {
          psVar3[lVar6] = 1.0 / cv_mem->cv_h;
          lVar6 = lVar6 + 1;
        } while (lVar7 != lVar6);
      }
      iVar5 = N_VScaleVectorArray(lVar7,cv_mem->cv_cvals,cv_mem->cv_znS[1],puVar2[3]);
      if (iVar5 != 0) {
        return -0x1c;
      }
    }
  }
  return 0;
}

Assistant:

static int CVAhermiteStorePnt(CVodeMem cv_mem, CVdtpntMem d)
{
  CVadjMem ca_mem;
  CVhermiteDataMem content;
  int is, retval;

  ca_mem = cv_mem->cv_adj_mem;

  content = (CVhermiteDataMem)d->content;

  /* Load solution */

  N_VScale(ONE, cv_mem->cv_zn[0], content->y);

  if (ca_mem->ca_IMstoreSensi)
  {
    for (is = 0; is < cv_mem->cv_Ns; is++) { cv_mem->cv_cvals[is] = ONE; }

    retval = N_VScaleVectorArray(cv_mem->cv_Ns, cv_mem->cv_cvals,
                                 cv_mem->cv_znS[0], content->yS);
    if (retval != CV_SUCCESS) { return (CV_VECTOROP_ERR); }
  }

  /* Load derivative */

  if (cv_mem->cv_nst == 0)
  {
    /* retval = */ cv_mem->cv_f(cv_mem->cv_tn, content->y, content->yd,
                                cv_mem->cv_user_data);

    if (ca_mem->ca_IMstoreSensi)
    {
      /* retval = */ cvSensRhsWrapper(cv_mem, cv_mem->cv_tn, content->y,
                                      content->yd, content->yS, content->ySd,
                                      cv_mem->cv_tempv, cv_mem->cv_ftemp);
    }
  }
  else
  {
    N_VScale(ONE / cv_mem->cv_h, cv_mem->cv_zn[1], content->yd);

    if (ca_mem->ca_IMstoreSensi)
    {
      for (is = 0; is < cv_mem->cv_Ns; is++)
      {
        cv_mem->cv_cvals[is] = ONE / cv_mem->cv_h;
      }

      retval = N_VScaleVectorArray(cv_mem->cv_Ns, cv_mem->cv_cvals,
                                   cv_mem->cv_znS[1], content->ySd);
      if (retval != CV_SUCCESS) { return (CV_VECTOROP_ERR); }
    }
  }

  return (0);
}